

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

void __thiscall
notch::core::SharedBuffers::allocate(SharedBuffers *this,size_t nInputs,size_t nOutputs)

{
  element_type *peVar1;
  element_type *peVar2;
  unsigned_long local_38;
  __shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2> local_30;
  size_t local_20;
  size_t local_18;
  
  peVar1 = (this->inputBuffer).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar2 = (this->outputBuffer).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar1 == (element_type *)0x0 || peVar2 == (element_type *)0x0) {
    local_20 = nOutputs;
    local_18 = nInputs;
    if (peVar1 == (element_type *)0x0) {
      local_38 = 0;
      ::std::make_shared<std::valarray<float>,double,unsigned_long&>((double *)&local_30,&local_38);
      std::__shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2> *)this,&local_30);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
      peVar2 = (this->outputBuffer).
               super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    if (peVar2 == (element_type *)0x0) {
      local_38 = 0;
      ::std::make_shared<std::valarray<float>,double,unsigned_long&>((double *)&local_30,&local_38);
      std::__shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->outputBuffer).
                  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>,&local_30);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    }
  }
  return;
}

Assistant:

void allocate(size_t nInputs, size_t nOutputs) {
        if (ready()) {
            return;
        }
        if (!inputBuffer) {
            inputBuffer = std::make_shared<Array>(0.0, nInputs);
        }
        if (!outputBuffer) {
            outputBuffer = std::make_shared<Array>(0.0, nOutputs);
        }
    }